

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_example_cpp(bool copy_on_write)

{
  undefined1 auVar1 [16];
  initializer_list<unsigned_int> l;
  initializer_list<unsigned_int> l_00;
  initializer_list<unsigned_int> l_01;
  initializer_list<unsigned_int> l_02;
  bool bVar2;
  value_type vVar3;
  ostream *poVar4;
  ulong uVar5;
  fd_set *__writefds;
  size_t __n;
  char *pcVar6;
  byte in_DIL;
  fd_set *__exceptfds;
  timeval *__timeout;
  Roaring a_3;
  Roaring b_2;
  Roaring a_2;
  Roaring a_1;
  Roaring b_1;
  Roaring a;
  Roaring b;
  const_iterator j;
  Roaring rogue;
  uint32_t manyvalues [5];
  const_iterator i_1;
  uint32_t counter;
  Roaring t2;
  Roaring t;
  char *serializedbytes;
  size_t expectedsize;
  Roaring i1_2;
  Roaring bigunion;
  Roaring *allmybitmaps [3];
  Roaring r1_2_3;
  Roaring z;
  Roaring r1f;
  uint32_t *arr1;
  uint64_t card1;
  Roaring r3;
  uint32_t values [3];
  uint32_t element;
  Roaring r2id;
  Roaring r2i;
  Roaring r2;
  size_t compact_size;
  size_t size;
  uint64_t cardinality;
  uint32_t i;
  Roaring r1;
  undefined4 uVar7;
  uint32_t in_stack_fffffffffffffa1c;
  RoaringSetBitBiDirectionalIterator *in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  undefined7 in_stack_fffffffffffffa30;
  undefined7 uVar8;
  undefined1 in_stack_fffffffffffffa37;
  undefined1 uVar9;
  Roaring *in_stack_fffffffffffffa38;
  Roaring *in_stack_fffffffffffffa40;
  Roaring *in_stack_fffffffffffffa48;
  Roaring *in_stack_fffffffffffffa50;
  Roaring *this;
  Roaring *this_00;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  size_t in_stack_fffffffffffffa68;
  string local_4e8 [16];
  char local_4c8 [44];
  undefined4 local_49c;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 *local_490;
  undefined8 local_488;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 *local_478;
  undefined8 local_470;
  Roaring local_3c8;
  Roaring local_3a0;
  RoaringSetBitBiDirectionalIterator local_378 [2];
  undefined8 local_328;
  undefined8 uStack_320;
  undefined4 local_318;
  int local_2bc;
  undefined1 local_290 [40];
  void *local_268;
  size_t local_260;
  Roaring *local_208;
  Roaring *local_200;
  undefined1 *local_1f8;
  void *local_170;
  uint64_t local_168;
  undefined1 local_160 [40];
  undefined8 local_138;
  undefined4 local_130;
  fd_set local_12c;
  Roaring local_88;
  size_t local_60;
  size_t local_58;
  ulong local_50;
  uint local_34;
  Roaring local_30;
  byte local_1;
  
  local_1 = in_DIL & 1;
  roaring::Roaring::Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::setCopyOnWrite
            ((Roaring *)in_stack_fffffffffffffa20,SUB41(in_stack_fffffffffffffa1c >> 0x18,0));
  for (local_34 = 100; local_34 < 1000; local_34 = local_34 + 1) {
    roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  }
  roaring::Roaring::contains((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  local_50 = roaring::Roaring::cardinality((Roaring *)in_stack_fffffffffffffa20);
  poVar4 = std::operator<<((ostream *)&std::cout,"Cardinality = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_50);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_58 = roaring::Roaring::getSizeInBytes
                       (in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
  roaring::Roaring::runOptimize((Roaring *)in_stack_fffffffffffffa20);
  local_60 = roaring::Roaring::getSizeInBytes
                       (in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
  poVar4 = std::operator<<((ostream *)&std::cout,"size before run optimize ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_58);
  poVar4 = std::operator<<(poVar4," bytes, and after ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_60);
  poVar4 = std::operator<<(poVar4," bytes.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar7 = 6;
  pcVar6 = (char *)0x5;
  __exceptfds = (fd_set *)0x3;
  __timeout = (timeval *)0x5;
  roaring::Roaring::bitmapOf((size_t)&local_88,5,1,2);
  roaring::Roaring::printf(&local_88,pcVar6);
  printf("\n");
  local_12c.fds_bits._84_8_ = 0x200000001;
  local_12c.fds_bits._92_8_ = 0x500000003;
  local_12c.fds_bits[0xc]._4_4_ = 6;
  local_12c.fds_bits._108_8_ = (long)local_12c.fds_bits + 0x54;
  local_12c.fds_bits._116_8_ = 5;
  l_01._M_array._7_1_ = in_stack_fffffffffffffa37;
  l_01._M_array._0_7_ = in_stack_fffffffffffffa30;
  l_01._M_len = (size_type)in_stack_fffffffffffffa38;
  roaring::Roaring::bitmapOfList(l_01);
  roaring::Roaring::operator==
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  local_12c.fds_bits._4_8_ = 0x200000001;
  local_12c.fds_bits._12_8_ = 0x500000003;
  local_12c.fds_bits[2]._4_4_ = 6;
  local_12c.fds_bits._28_8_ = (long)local_12c.fds_bits + 4;
  local_12c.fds_bits._36_8_ = 5;
  l._M_array._4_4_ = in_stack_fffffffffffffa2c;
  l._M_array._0_4_ = in_stack_fffffffffffffa28;
  l._M_len._0_7_ = in_stack_fffffffffffffa30;
  l._M_len._7_1_ = in_stack_fffffffffffffa37;
  roaring::Roaring::Roaring((Roaring *)in_stack_fffffffffffffa20,l);
  roaring::Roaring::operator==
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  __writefds = (fd_set *)0x158;
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::select(&local_88,3,&local_12c,__writefds,__exceptfds,__timeout);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::minimum((Roaring *)in_stack_fffffffffffffa20);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::maximum((Roaring *)in_stack_fffffffffffffa20);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::rank((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  local_138 = 0x300000002;
  local_130 = 4;
  roaring::Roaring::Roaring
            (in_stack_fffffffffffffa40,(size_t)in_stack_fffffffffffffa38,
             (uint32_t *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  roaring::Roaring::setCopyOnWrite
            ((Roaring *)in_stack_fffffffffffffa20,SUB41(in_stack_fffffffffffffa1c >> 0x18,0));
  local_168 = roaring::Roaring::cardinality((Roaring *)in_stack_fffffffffffffa20);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_168;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_170 = operator_new__(uVar5);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::toUint32Array
            ((Roaring *)in_stack_fffffffffffffa20,
             (uint32_t *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  roaring::Roaring::Roaring
            (in_stack_fffffffffffffa40,(size_t)in_stack_fffffffffffffa38,
             (uint32_t *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  if (local_170 != (void *)0x0) {
    operator_delete__(local_170);
  }
  roaring::Roaring::operator==
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::Roaring(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  roaring::Roaring::setCopyOnWrite
            ((Roaring *)in_stack_fffffffffffffa20,SUB41(in_stack_fffffffffffffa1c >> 0x18,0));
  roaring::Roaring::operator==
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::operator|(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  roaring::Roaring::setCopyOnWrite
            ((Roaring *)in_stack_fffffffffffffa20,SUB41(in_stack_fffffffffffffa1c >> 0x18,0));
  roaring::Roaring::operator|=
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  local_208 = &local_30;
  local_200 = &local_88;
  local_1f8 = local_160;
  roaring::Roaring::fastunion
            (in_stack_fffffffffffffa68,
             (Roaring **)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  roaring::Roaring::operator==
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  __n = 0x182;
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::operator&(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  local_260 = roaring::Roaring::getSizeInBytes
                        (in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
  local_268 = operator_new__(local_260);
  roaring::Roaring::write(&local_30,(int)local_268,(void *)0x1,__n);
  roaring::Roaring::read((int)local_290,local_268,1);
  roaring::Roaring::getSizeInBytes(in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::operator==
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::readSafe((char *)in_stack_fffffffffffffa48,(size_t)in_stack_fffffffffffffa40);
  roaring::Roaring::getSizeInBytes(in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::operator==
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  if (local_268 != (void *)0x0) {
    operator_delete__(local_268);
  }
  local_2bc = 0;
  roaring::Roaring::iterate
            ((Roaring *)in_stack_fffffffffffffa20,
             (roaring_iterator)CONCAT44(in_stack_fffffffffffffa1c,uVar7),(void *)0x1058d9);
  local_2bc = 0;
  roaring::Roaring::begin((Roaring *)in_stack_fffffffffffffa20);
  while( true ) {
    roaring::Roaring::end((Roaring *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    bVar2 = roaring::RoaringSetBitBiDirectionalIterator::operator!=
                      ((RoaringSetBitBiDirectionalIterator *)
                       CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                       (RoaringSetBitBiDirectionalIterator *)
                       CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    if (!bVar2) break;
    local_2bc = local_2bc + 1;
    roaring::RoaringSetBitBiDirectionalIterator::operator++
              ((RoaringSetBitBiDirectionalIterator *)
               CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa2c);
  }
  roaring::Roaring::cardinality((Roaring *)in_stack_fffffffffffffa20);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  local_328 = 0x300000002;
  uStack_320 = 0x700000004;
  local_318 = 8;
  roaring::Roaring::Roaring
            (in_stack_fffffffffffffa40,(size_t)in_stack_fffffffffffffa38,
             (uint32_t *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  roaring::Roaring::begin((Roaring *)in_stack_fffffffffffffa20);
  roaring::RoaringSetBitBiDirectionalIterator::move_equalorlarger
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  vVar3 = roaring::RoaringSetBitBiDirectionalIterator::operator*(local_378);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::Roaring((Roaring *)in_stack_fffffffffffffa20);
  this = &local_3a0;
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  this_00 = &local_3c8;
  roaring::Roaring::Roaring
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  roaring::Roaring::cardinality((Roaring *)in_stack_fffffffffffffa20);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::contains((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::contains((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::cardinality((Roaring *)in_stack_fffffffffffffa20);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::operator=
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  roaring::Roaring::cardinality((Roaring *)in_stack_fffffffffffffa20);
  _assert_int_equal(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                    CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                    (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::contains((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::contains((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::cardinality((Roaring *)in_stack_fffffffffffffa20);
  _assert_int_equal(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                    CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                    (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  local_480 = 10;
  local_47c = 0x14;
  local_478 = &local_480;
  local_470 = 2;
  l_00._M_array._4_4_ = in_stack_fffffffffffffa2c;
  l_00._M_array._0_4_ = in_stack_fffffffffffffa28;
  l_00._M_len._0_7_ = in_stack_fffffffffffffa30;
  l_00._M_len._7_1_ = in_stack_fffffffffffffa37;
  roaring::Roaring::Roaring((Roaring *)in_stack_fffffffffffffa20,l_00);
  roaring::Roaring::operator==
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  local_49c = 10;
  local_498 = 0x14;
  local_494 = 0x1e;
  local_490 = &local_49c;
  local_488 = 3;
  l_02._M_len._0_4_ = in_stack_fffffffffffffa60;
  l_02._M_array = (iterator)this_00;
  l_02._M_len._4_4_ = vVar3;
  roaring::Roaring::operator=(this,l_02);
  roaring::Roaring::operator==
            ((Roaring *)in_stack_fffffffffffffa20,
             (Roaring *)CONCAT44(in_stack_fffffffffffffa1c,uVar7));
  _assert_true(CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::Roaring((Roaring *)in_stack_fffffffffffffa20);
  pcVar6 = local_4c8;
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  roaring::Roaring::add((Roaring *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  uVar8 = SUB87(local_4e8,0);
  uVar9 = (undefined1)((ulong)local_4e8 >> 0x38);
  roaring::Roaring::toString_abi_cxx11_(this_00);
  std::__cxx11::string::c_str();
  _assert_string_equal
            ((char *)CONCAT17(uVar9,uVar8),pcVar6,(char *)in_stack_fffffffffffffa20,
             in_stack_fffffffffffffa1c);
  std::__cxx11::string::~string(local_4e8);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  roaring::Roaring::~Roaring((Roaring *)in_stack_fffffffffffffa20);
  return;
}

Assistant:

void test_example_cpp(bool copy_on_write) {
    // create a new empty bitmap
    Roaring r1;
    r1.setCopyOnWrite(copy_on_write);
    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) {
        r1.add(i);
    }

    // check whether a value is contained
    assert_true(r1.contains(500));

    // compute how many bits there are:
    uint64_t cardinality = r1.cardinality();
    std::cout << "Cardinality = " << cardinality << std::endl;

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    size_t size = r1.getSizeInBytes();
    r1.runOptimize();
    size_t compact_size = r1.getSizeInBytes();

    std::cout << "size before run optimize " << size << " bytes, and after "
              << compact_size << " bytes." << std::endl;

    // create a new bitmap with varargs
    Roaring r2 = Roaring::bitmapOf(5, 1, 2, 3, 5, 6);

    r2.printf();
    printf("\n");
    // create a new bitmap with initializer list
    Roaring r2i = Roaring::bitmapOfList({1, 2, 3, 5, 6});

    assert_true(r2i == r2);

    // create a new bitmap directly from initializer list
    Roaring r2id = {1, 2, 3, 5, 6};

    assert_true(r2id == r2);

    // test select
    uint32_t element;
    r2.select(3, &element);
    assert_true(element == 5);

    assert_true(r2.minimum() == 1);

    assert_true(r2.maximum() == 6);

    assert_true(r2.rank(4) == 3);

    // we can also create a bitmap from a pointer to 32-bit integers
    const uint32_t values[] = {2, 3, 4};
    Roaring r3(3, values);
    r3.setCopyOnWrite(copy_on_write);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = r1.cardinality();
    uint32_t *arr1 = new uint32_t[card1];
    assert_true(arr1 != NULL);
    r1.toUint32Array(arr1);
    Roaring r1f(card1, arr1);
    delete[] arr1;

    // bitmaps shall be equal
    assert_true(r1 == r1f);

    // we can copy and compare bitmaps
    Roaring z(r3);
    z.setCopyOnWrite(copy_on_write);
    assert_true(r3 == z);

    // we can compute union two-by-two
    Roaring r1_2_3 = r1 | r2;
    r1_2_3.setCopyOnWrite(copy_on_write);
    r1_2_3 |= r3;

    // we can compute a big union
    const Roaring *allmybitmaps[] = {&r1, &r2, &r3};
    Roaring bigunion = Roaring::fastunion(3, allmybitmaps);
    assert_true(r1_2_3 == bigunion);

    // we can compute intersection two-by-two
    Roaring i1_2 = r1 & r2;

    // we can write a bitmap to a pointer and recover it later
    size_t expectedsize = r1.getSizeInBytes();
    char *serializedbytes = new char[expectedsize];
    r1.write(serializedbytes);
    Roaring t = Roaring::read(serializedbytes);
    assert_true(expectedsize == t.getSizeInBytes());
    assert_true(r1 == t);

    Roaring t2 = Roaring::readSafe(serializedbytes, expectedsize);
    assert_true(expectedsize == t2.getSizeInBytes());
    assert_true(r1 == t2);

    delete[] serializedbytes;

    // we can iterate over all values using custom functions
    uint32_t counter = 0;
    r1.iterate(roaring_iterator_sumall, &counter);
    /**
     * void roaring_iterator_sumall(uint32_t value, void *param) {
     *        *(uint32_t *) param += value;
     *  }
     *
     */
    // we can also iterate the C++ way
    counter = 0;
    for (Roaring::const_iterator i = t.begin(); i != t.end(); i++) {
        ++counter;
    }
    assert_true(counter == t.cardinality());

    // we can move iterators
    const uint32_t manyvalues[] = {2, 3, 4, 7, 8};
    Roaring rogue(5, manyvalues);
    Roaring::const_iterator j = rogue.begin();
    j.move_equalorlarger(4);
    assert_true(*j == 4);

    // test move constructor
    {
        Roaring b;
        b.add(10);
        b.add(20);

        Roaring a(std::move(b));
        assert_true(a.cardinality() == 2);
        assert_true(a.contains(10));
        assert_true(a.contains(20));

        // Our move semantics allow moved-from objects to continue to be used
        // normally (they are reset to empty Roarings).
        assert_true(b.cardinality() == 0);
    }

    // test move operator
    {
        Roaring b;
        b.add(10);
        b.add(20);

        Roaring a;

        a = std::move(b);
        assert_int_equal(2, a.cardinality());
        assert_true(a.contains(10));
        assert_true(a.contains(20));

        // Our move semantics allow moved-from objects to continue to be used
        // normally (they are reset to empty Roarings).
        assert_int_equal(0, b.cardinality());
    }

    // test initializer lists
    {
        Roaring a;
        a.add(10);
        a.add(20);

        // construction
        Roaring b({10, 20});
        assert_true(a == b);

        a.add(30);
        // assignment
        b = {10, 20, 30};
        assert_true(a == b);
    }

    // test toString
    {
        Roaring a;
        a.add(1);
        a.add(2);
        a.add(3);
        a.add(4);

        assert_string_equal("{1,2,3,4}", a.toString().c_str());
    }
}